

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_server.cpp
# Opt level: O3

void __thiscall TcpServer::~TcpServer(TcpServer *this)

{
  _Manager_type p_Var1;
  Threadpool *__ptr;
  pointer ppEVar2;
  
  p_Var1 = (this->ts_close_cb).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->ts_close_cb,(_Any_data *)&this->ts_close_cb,__destroy_functor);
  }
  p_Var1 = (this->ts_message_cb).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->ts_message_cb,(_Any_data *)&this->ts_message_cb,__destroy_functor)
    ;
  }
  p_Var1 = (this->ts_msg_cb).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->ts_msg_cb,(_Any_data *)&this->ts_msg_cb,__destroy_functor);
  }
  p_Var1 = (this->ts_connected_cb).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->ts_connected_cb,(_Any_data *)&this->ts_connected_cb,
              __destroy_functor);
  }
  std::vector<std::shared_ptr<TcpConnection>,_std::allocator<std::shared_ptr<TcpConnection>_>_>::
  ~vector(&this->ts_tcp_connections);
  Timer::~Timer(&this->ts_timer);
  __ptr = (this->ts_thread_pool)._M_t.
          super___uniq_ptr_impl<Threadpool,_std::default_delete<Threadpool>_>._M_t.
          super__Tuple_impl<0UL,_Threadpool_*,_std::default_delete<Threadpool>_>.
          super__Head_base<0UL,_Threadpool_*,_false>._M_head_impl;
  if (__ptr != (Threadpool *)0x0) {
    std::default_delete<Threadpool>::operator()
              ((default_delete<Threadpool> *)&this->ts_thread_pool,__ptr);
  }
  (this->ts_thread_pool)._M_t.super___uniq_ptr_impl<Threadpool,_std::default_delete<Threadpool>_>.
  _M_t.super__Tuple_impl<0UL,_Threadpool_*,_std::default_delete<Threadpool>_>.
  super__Head_base<0UL,_Threadpool_*,_false>._M_head_impl = (Threadpool *)0x0;
  ppEVar2 = (this->ts_conn_loops).super__Vector_base<EventLoop_*,_std::allocator<EventLoop_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppEVar2 != (pointer)0x0) {
    operator_delete(ppEVar2,(long)(this->ts_conn_loops).
                                  super__Vector_base<EventLoop_*,_std::allocator<EventLoop_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppEVar2)
    ;
  }
  std::unique_ptr<Acceptor,_std::default_delete<Acceptor>_>::~unique_ptr(&this->ts_acceptor);
  return;
}

Assistant:

TcpServer::~TcpServer() {

}